

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_function.hpp
# Opt level: O2

object boost::python::detail::
       make_function_aux<void(*)(_object*,HighFreqDataType,int),boost::python::default_call_policies,boost::mpl::vector4<void,_object*,HighFreqDataType,int>,mpl_::int_<0>>
                 (object_base f,
                 compressed_pair_imp<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_2>
                 p,undefined8 param_3,undefined8 param_4,pair *param_5)

{
  pointer *__ptr;
  py_function local_28;
  compressed_pair<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies>
  local_20;
  
  local_20.
  super_compressed_pair_imp<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_2>
  .first_ = (compressed_pair_imp<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_2>
             )(compressed_pair_imp<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_2>
               )p.first_;
  objects::py_function::
  py_function<boost::python::detail::caller<void(*)(_object*,HighFreqDataType,int),boost::python::default_call_policies,boost::mpl::vector4<void,_object*,HighFreqDataType,int>>>
            (&local_28,
             (caller<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_boost::mpl::vector4<void,__object_*,_HighFreqDataType,_int>_>
              *)&local_20);
  objects::function_object((objects *)f.m_ptr,&local_28,param_5);
  if (local_28.m_impl._M_t.
      super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
      .super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_28.m_impl._M_t.
                          super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                          .
                          super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>
                          ._M_head_impl + 8))();
  }
  return (object)(object_base)f.m_ptr;
}

Assistant:

object make_function_aux(
      F f
      , CallPolicies const& p
      , Sig const&
      , detail::keyword_range const& kw // a [begin,end) pair of iterators over keyword names
      , NumKeywords                     // An MPL integral type wrapper: the size of kw
      )
  {
      enum { arity = mpl::size<Sig>::value - 1 };
      
      typedef typename detail::error::more_keywords_than_function_arguments<
          NumKeywords::value, arity
          >::too_many_keywords assertion BOOST_ATTRIBUTE_UNUSED;
    
      return objects::function_object(
          detail::caller<F,CallPolicies,Sig>(f, p)
        , kw);
  }